

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.cc
# Opt level: O3

void __thiscall mp::NameProvider::ReadNames(NameProvider *this,CStringRef filename,size_t num_items)

{
  NameHandler handler;
  char *local_38;
  NameHandler local_30;
  
  local_30.name_.data_ = "";
  local_30.name_.size_ = 0;
  local_30.names_ = &this->names_;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::reserve(&this->names_,num_items + 1);
  internal::NameReader::Read<internal::NameHandler>(&this->reader_,filename,&local_30);
  local_38 = local_30.name_.data_ + local_30.name_.size_ + 1;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)this,&local_38);
  return;
}

Assistant:

void mp::NameProvider::ReadNames(
    fmt::CStringRef filename, std::size_t num_items) {
  ::internal::NameHandler handler(names_);
  names_.reserve(num_items + 1);
  try {
    reader_.Read(filename, handler);
  } catch (const fmt::SystemError &) {
    return; // System error, ignore the file and use generated names.
  }
  fmt::StringRef last_name = handler.name();
  names_.push_back(last_name.data() + last_name.size() + 1);
}